

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowOpts.cpp
# Opt level: O0

void __thiscall wasm::DataFlowOpts::workOn(DataFlowOpts *this,Node *node)

{
  bool bVar1;
  Index IVar2;
  Node *this_00;
  Node *value;
  Node *node_local;
  DataFlowOpts *this_local;
  
  bVar1 = DataFlow::Node::isConst(node);
  if ((!bVar1) && (IVar2 = DataFlow::Users::getNumUses(&this->nodeUsers,node), IVar2 != 0)) {
    bVar1 = DataFlow::Node::isPhi(node);
    if ((bVar1) && (bVar1 = DataFlow::allInputsIdentical(node), bVar1)) {
      this_00 = DataFlow::Node::getValue(node,1);
      bVar1 = DataFlow::Node::isConst(this_00);
      if (bVar1) {
        replaceAllUsesWith(this,node,this_00);
      }
    }
    else {
      bVar1 = DataFlow::Node::isExpr(node);
      if ((bVar1) && (bVar1 = DataFlow::allInputsConstant(node), bVar1)) {
        bVar1 = DataFlow::Node::isConst(node);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          __assert_fail("!node->isConst()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DataFlowOpts.cpp"
                        ,0x69,"void wasm::DataFlowOpts::workOn(DataFlow::Node *)");
        }
        bVar1 = wasm::Type::isConcrete(&((node->field_1).expr)->type);
        if (bVar1) {
          optimizeExprToConstant(this,node);
        }
      }
    }
  }
  return;
}

Assistant:

void workOn(DataFlow::Node* node) {
    if (node->isConst()) {
      return;
    }
    // If there are no uses, there is no point to work.
    if (nodeUsers.getNumUses(node) == 0) {
      return;
    }
    // Optimize: Look for nodes that we can easily convert into
    // something simpler.
    // TODO: we can expressionify and run full normal opts on that,
    //       then copy the result if it's smaller.
    if (node->isPhi() && DataFlow::allInputsIdentical(node)) {
      // Note we don't need to check for effects when replacing, as in
      // flattened IR expression children are local.gets or consts.
      auto* value = node->getValue(1);
      if (value->isConst()) {
        replaceAllUsesWith(node, value);
      }
    } else if (node->isExpr() && DataFlow::allInputsConstant(node)) {
      assert(!node->isConst());
      // If this is a concrete value (not e.g. an eqz of unreachable),
      // it can definitely be precomputed into a constant.
      if (node->expr->type.isConcrete()) {
        // This can be precomputed.
        // TODO not just all-constant inputs? E.g. i32.mul of 0 and X.
        optimizeExprToConstant(node);
      }
    }
  }